

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSMF.cpp
# Opt level: O0

DWORD __thiscall dsa::CSMF::ReadNextVnum(CSMF *this,int trk)

{
  byte bVar1;
  undefined4 local_1c;
  undefined4 local_18;
  int d;
  int ret;
  int trk_local;
  CSMF *this_local;
  
  bVar1 = ReadNextByte(this,trk);
  local_1c = (uint)bVar1;
  local_18 = local_1c & 0x7f;
  while ((local_1c & 0x80) != 0) {
    bVar1 = ReadNextByte(this,trk);
    local_1c = (uint)bVar1;
    local_18 = local_18 << 7 | local_1c & 0x7f;
  }
  return (long)(int)local_18;
}

Assistant:

DWORD CSMF::ReadNextVnum(int trk) {
  int ret, d;

  ret = d = ReadNextByte(trk);
  ret&=0x7F;
  while(d&0x80) {
    d = ReadNextByte(trk);
    ret = (ret<<7)|(d&0x7f);
  }
  return ret;
}